

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfo.cpp
# Opt level: O0

InfoStatus
getLocalInfoValue(HighsLogOptions *report_log_options,string *name,bool valid,
                 vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *info_records,HighsInt *value)

{
  const_reference ppIVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *in_RCX;
  byte in_DL;
  HighsLogOptions *in_RDI;
  undefined4 *in_R8;
  InfoRecordInt64 info_1;
  InfoRecordInt info;
  string illegal_type;
  bool type_ok;
  HighsInfoType type;
  InfoStatus status;
  HighsInt index;
  InfoRecordInt *in_stack_fffffffffffffe78;
  InfoRecordInt *in_stack_fffffffffffffe80;
  vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *in_stack_fffffffffffffe88;
  string *in_stack_fffffffffffffe90;
  allocator *paVar5;
  HighsLogOptions *in_stack_fffffffffffffe98;
  HighsInfoType in_stack_fffffffffffffeac;
  undefined4 *local_a8;
  string local_98 [55];
  allocator local_61;
  string local_60 [35];
  undefined1 local_3d;
  HighsInfoType local_3c;
  InfoStatus local_38;
  int local_34;
  undefined4 *local_30;
  vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *local_28;
  byte local_19;
  HighsLogOptions *local_10;
  InfoStatus local_4;
  
  local_19 = in_DL & 1;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_10 = in_RDI;
  local_38 = getInfoIndex(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                          in_stack_fffffffffffffe88,(HighsInt *)in_stack_fffffffffffffe80);
  local_4 = local_38;
  if (local_38 == kOk) {
    if ((local_19 & 1) == 0) {
      local_4 = kUnavailable;
    }
    else {
      ppIVar1 = std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::operator[]
                          (local_28,(long)local_34);
      local_3c = (*ppIVar1)->type;
      local_3d = local_3c == kInt;
      if ((bool)local_3d) {
        std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::operator[]
                  (local_28,(long)local_34);
        InfoRecordInt::InfoRecordInt(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        *local_30 = *local_a8;
        InfoRecordInt::~InfoRecordInt((InfoRecordInt *)0x4d2655);
        local_4 = kOk;
      }
      else {
        paVar5 = &local_61;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_60,"HighsInt",paVar5);
        std::allocator<char>::~allocator((allocator<char> *)&local_61);
        uVar2 = std::__cxx11::string::c_str();
        infoEntryTypeToString_abi_cxx11_(in_stack_fffffffffffffeac);
        uVar3 = std::__cxx11::string::c_str();
        uVar4 = std::__cxx11::string::c_str();
        highsLogUser(local_10,kError,"getInfoValue: Info \"%s\" requires value of type %s, not %s\n"
                     ,uVar2,uVar3,uVar4);
        std::__cxx11::string::~string(local_98);
        local_4 = kIllegalValue;
        std::__cxx11::string::~string(local_60);
      }
    }
  }
  return local_4;
}

Assistant:

InfoStatus getLocalInfoValue(const HighsLogOptions& report_log_options,
                             const std::string& name, const bool valid,
                             const std::vector<InfoRecord*>& info_records,
                             HighsInt& value) {
  HighsInt index;
  InfoStatus status =
      getInfoIndex(report_log_options, name, info_records, index);
  if (status != InfoStatus::kOk) return status;
  if (!valid) return InfoStatus::kUnavailable;
  HighsInfoType type = info_records[index]->type;
  bool type_ok = type == HighsInfoType::kInt;
  // When HIGHSINT64 is "on", value is int64_t and this method is used
  // get HighsInfo values of type HighsInfoType::kInt64
#ifdef HIGHSINT64
  type_ok = type_ok || type == HighsInfoType::kInt64;
#endif
  if (!type_ok) {
    std::string illegal_type = "HighsInt";
#ifdef HIGHSINT64
    illegal_type += " or int64_t";
#endif
    highsLogUser(
        report_log_options, HighsLogType::kError,
        "getInfoValue: Info \"%s\" requires value of type %s, not %s\n",
        name.c_str(), infoEntryTypeToString(type).c_str(),
        illegal_type.c_str());
    return InfoStatus::kIllegalValue;
  }
  if (type == HighsInfoType::kInt) {
    InfoRecordInt info = ((InfoRecordInt*)info_records[index])[0];
    value = *info.value;
  } else {
    assert(type == HighsInfoType::kInt64);
    InfoRecordInt64 info = ((InfoRecordInt64*)info_records[index])[0];
    value = *info.value;
  }
  return InfoStatus::kOk;
}